

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_lpc_swb.c
# Opt level: O0

int16_t WebRtcIsac_DecorrelateInterVec(double *data,double *out,int16_t bandwidth)

{
  int iVar1;
  short local_32;
  double (*padStack_30) [4];
  int16_t interVecDim;
  double *decorrMat;
  int16_t colCntr;
  int16_t rowCntr;
  int16_t coeffCntr;
  int16_t bandwidth_local;
  double *out_local;
  double *data_local;
  
  if (bandwidth == 0xc) {
    padStack_30 = (double (*) [4])WebRtcIsac_kInterVecDecorrMatUb12;
    local_32 = 2;
  }
  else {
    if (bandwidth != 0x10) {
      return -1;
    }
    padStack_30 = WebRtcIsac_kInterVecDecorrMatUb16;
    local_32 = 4;
  }
  for (decorrMat._4_2_ = 0; decorrMat._4_2_ < 4; decorrMat._4_2_ = decorrMat._4_2_ + 1) {
    for (decorrMat._0_2_ = 0; (short)decorrMat < local_32; decorrMat._0_2_ = (short)decorrMat + 1) {
      out[(int)decorrMat._4_2_ + (short)decorrMat * 4] = 0.0;
      for (decorrMat._2_2_ = 0; decorrMat._2_2_ < local_32; decorrMat._2_2_ = decorrMat._2_2_ + 1) {
        iVar1 = (int)decorrMat._4_2_ + (short)decorrMat * 4;
        out[iVar1] = data[(int)decorrMat._4_2_ + decorrMat._2_2_ * 4] *
                     (*padStack_30)[(int)decorrMat._2_2_ * (int)local_32 + (int)(short)decorrMat] +
                     out[iVar1];
      }
    }
  }
  return 0;
}

Assistant:

int16_t
WebRtcIsac_DecorrelateInterVec(
    const double* data,
    double* out,
    int16_t bandwidth)
{
  int16_t coeffCntr;
  int16_t rowCntr;
  int16_t colCntr;
  const double* decorrMat;
  int16_t interVecDim;

  switch(bandwidth)
  {
    case isac12kHz:
      {
        decorrMat = &WebRtcIsac_kInterVecDecorrMatUb12[0][0];
        interVecDim = UB_LPC_VEC_PER_FRAME;
        break;
      }
    case isac16kHz:
      {
        decorrMat = &WebRtcIsac_kInterVecDecorrMatUb16[0][0];
        interVecDim = UB16_LPC_VEC_PER_FRAME;
        break;
      }
    default:
      return -1;
  }

  //
  // data * decorrMat
  //
  // data is of size 'interVecDim' * 'UB_LPC_ORDER'
  // That is 'interVecDim' of LAR vectors (mean removed)
  // in columns each of dimension 'UB_LPC_ORDER'.
  // matrix is stored column-wise.
  //

  for(coeffCntr = 0; coeffCntr < UB_LPC_ORDER; coeffCntr++)
  {
    for(colCntr = 0; colCntr < interVecDim; colCntr++)
    {
      out[coeffCntr + colCntr * UB_LPC_ORDER] = 0;
      for(rowCntr = 0; rowCntr < interVecDim; rowCntr++)
      {
        out[coeffCntr + colCntr * UB_LPC_ORDER] +=
            data[coeffCntr + rowCntr * UB_LPC_ORDER] *
            decorrMat[rowCntr * interVecDim + colCntr];
      }
    }
  }
  return 0;
}